

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa.cpp
# Opt level: O0

void __thiscall mocker::SSADestruction::insertAllocas(SSADestruction *this)

{
  FunctionModule *hint;
  bool bVar1;
  BasicBlockList *this_00;
  reference this_01;
  InstList *this_02;
  element_type *peVar2;
  __shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_03;
  element_type *this_04;
  string *__args;
  mapped_type *this_05;
  pointer this_06;
  shared_ptr<mocker::ir::Alloca> local_110;
  shared_ptr<mocker::ir::IRInst> local_100;
  _List_iterator<mocker::ir::BasicBlock> local_f0;
  allocator<char> local_e1;
  string local_e0 [32];
  undefined1 local_c0 [8];
  shared_ptr<mocker::ir::Reg> addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *varName;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  undefined1 local_88 [8];
  shared_ptr<mocker::ir::Phi> phi;
  shared_ptr<mocker::ir::IRInst> *inst;
  const_iterator __end2;
  const_iterator __begin2;
  InstList *__range2;
  BasicBlock *bb;
  const_iterator __end1;
  const_iterator __begin1;
  BasicBlockList *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varNames;
  SSADestruction *this_local;
  
  varNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  this_00 = ir::FunctionModule::getBBs_abi_cxx11_((this->super_FuncPass).func);
  __end1 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
           begin(this_00);
  bb = (BasicBlock *)
       std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                 (this_00);
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&bb);
    if (!bVar1) {
      __end1_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range1);
      varName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range1);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&varName), bVar1) {
        addr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1_1);
        hint = (this->super_FuncPass).func;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_e0,"",&local_e1);
        ir::FunctionModule::makeTempLocalReg((FunctionModule *)local_c0,&hint->identifier);
        std::__cxx11::string::~string(local_e0);
        std::allocator<char>::~allocator(&local_e1);
        this_05 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
                  ::operator[](&this->addresses,
                               (key_type *)
                               addr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
        std::shared_ptr<mocker::ir::Reg>::operator=(this_05,(shared_ptr<mocker::ir::Reg> *)local_c0)
        ;
        local_f0._M_node =
             (_List_node_base *)ir::FunctionModule::getFirstBB((this->super_FuncPass).func);
        this_06 = std::_List_iterator<mocker::ir::BasicBlock>::operator->(&local_f0);
        std::make_shared<mocker::ir::Alloca,std::shared_ptr<mocker::ir::Reg>&>
                  ((shared_ptr<mocker::ir::Reg> *)&local_110);
        std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Alloca,void>
                  (&local_100,&local_110);
        ir::BasicBlock::appendInstFront(this_06,&local_100);
        std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_100);
        std::shared_ptr<mocker::ir::Alloca>::~shared_ptr(&local_110);
        std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_c0);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1_1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1);
      return;
    }
    this_01 = std::_List_const_iterator<mocker::ir::BasicBlock>::operator*(&__end1);
    this_02 = ir::BasicBlock::getInsts_abi_cxx11_(this_01);
    __end2 = std::__cxx11::
             list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
             ::begin(this_02);
    inst = (shared_ptr<mocker::ir::IRInst> *)
           std::__cxx11::
           list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
           ::end(this_02);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&inst), bVar1) {
      phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*(&__end2);
      ir::dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)local_88,
                 (shared_ptr<mocker::ir::IRInst> *)
                 phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_88);
      if (bVar1) {
        peVar2 = std::__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_88);
        this_03 = (__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  ir::Definition::getDest(&peVar2->super_Definition);
        this_04 = std::
                  __shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(this_03);
        __args = ir::Reg::getIdentifier_abi_cxx11_(this_04);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range1,
                   __args);
      }
      std::shared_ptr<mocker::ir::Phi>::~shared_ptr((shared_ptr<mocker::ir::Phi> *)local_88);
      if (!bVar1) break;
      std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&__end2);
    }
    std::_List_const_iterator<mocker::ir::BasicBlock>::operator++(&__end1);
  } while( true );
}

Assistant:

void SSADestruction::insertAllocas() {
  std::vector<std::string> varNames;

  for (auto &bb : func.getBBs()) {
    for (auto &inst : bb.getInsts()) {
      auto phi = ir::dyc<ir::Phi>(inst);
      if (!phi)
        break;
      varNames.emplace_back(phi->getDest()->getIdentifier());
    }
  }

  for (auto &varName : varNames) {
    auto addr = func.makeTempLocalReg();
    addresses[varName] = addr;
    func.getFirstBB()->appendInstFront(std::make_shared<ir::Alloca>(addr));
  }
}